

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_decoder.cc
# Opt level: O3

void __thiscall
draco::RAnsBitDecoder::DecodeLeastSignificantBits32(RAnsBitDecoder *this,int nbits,uint32_t *value)

{
  bool bVar1;
  uint32_t uVar2;
  
  if (nbits == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      bVar1 = DecodeNextBit(this);
      uVar2 = (uint)bVar1 + uVar2 * 2;
      nbits = nbits + -1;
    } while (nbits != 0);
  }
  *value = uVar2;
  return;
}

Assistant:

void RAnsBitDecoder::DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
  DRACO_DCHECK_EQ(true, nbits <= 32);
  DRACO_DCHECK_EQ(true, nbits > 0);

  uint32_t result = 0;
  while (nbits) {
    result = (result << 1) + DecodeNextBit();
    --nbits;
  }
  *value = result;
}